

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

void __thiscall
cxxopts::option_requires_argument_exception::~option_requires_argument_exception
          (option_requires_argument_exception *this)

{
  OptionException::~OptionException((OptionException *)this);
  operator_delete(this,0x28);
  return;
}

Assistant:

option_requires_argument_exception(const std::string& option)
    : OptionParseException(
        "Option " + LQUOTE + option + RQUOTE + " requires an argument"
      )
    {
    }